

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest06VerifyingBasicConstraints_::
Section6InvalidMissingbasicConstraintsTest1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
::TestBody(Section6InvalidMissingbasicConstraintsTest1<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.6.1";
  local_88.should_validate = false;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3fc32f_006c8ea0,(char *(*) [3])&PTR_anon_var_dwarf_3fc361_006c8ec0,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest06VerifyingBasicConstraints,
                     Section6InvalidMissingbasicConstraintsTest1) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "MissingbasicConstraintsCACert",
                               "InvalidMissingbasicConstraintsTest1EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "MissingbasicConstraintsCACRL"};
  PkitsTestInfo info;
  info.test_number = "4.6.1";
  info.should_validate = false;

  this->RunTest(certs, crls, info);
}